

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DPolyDoor::Tick(DPolyDoor *this)

{
  bool bVar1;
  int iVar2;
  FPolyObj *this_00;
  bool local_6d;
  double absSpeed_1;
  TVector2<double> local_50;
  TAngle<double> local_40;
  TVector2<double> local_38;
  TAngle<double> local_28;
  double local_20;
  double absSpeed;
  FPolyObj *poly;
  DPolyDoor *this_local;
  
  poly = (FPolyObj *)this;
  this_00 = PO_GetPolyobj((this->super_DMovePoly).super_DPolyAction.m_PolyObj);
  if (this_00 != (FPolyObj *)0x0) {
    absSpeed = (double)this_00;
    if (this->m_Tics == 0) {
      if (this->m_Type == PODOOR_SLIDE) {
        if (((this->super_DMovePoly).super_DPolyAction.m_Dist <= 0.0) ||
           (bVar1 = FPolyObj::MovePolyobj(this_00,&(this->super_DMovePoly).m_Speedv,false), bVar1))
        {
          local_20 = ABS((this->super_DMovePoly).super_DPolyAction.m_Speed);
          (this->super_DMovePoly).super_DPolyAction.m_Dist =
               (this->super_DMovePoly).super_DPolyAction.m_Dist - local_20;
          if ((this->super_DMovePoly).super_DPolyAction.m_Dist <= 0.0) {
            SN_StopSequence((FPolyObj *)absSpeed);
            if (((this->m_Close & 1U) == 0) && (-1 < this->m_WaitTics)) {
              (this->super_DMovePoly).super_DPolyAction.m_Dist = this->m_TotalDist;
              this->m_Close = true;
              this->m_Tics = this->m_WaitTics;
              TAngle<double>::operator-(&local_28);
              TAngle<double>::operator=(&this->m_Direction,&local_28);
              TVector2<double>::operator-(&local_38);
              TVector2<double>::operator=(&(this->super_DMovePoly).m_Speedv,&local_38);
            }
            else {
              if ((this->m_Close & 1U) == 0) {
                *(undefined1 *)((long)absSpeed + 0xc5) = 1;
              }
              (*(this->super_DMovePoly).super_DPolyAction.super_DThinker.super_DObject._vptr_DObject
                [4])();
            }
          }
          FPolyObj::UpdateLinks((FPolyObj *)absSpeed);
        }
        else if ((*(int *)((long)absSpeed + 0xc0) == 0) && ((this->m_Close & 1U) != 0)) {
          (this->super_DMovePoly).super_DPolyAction.m_Dist =
               this->m_TotalDist - (this->super_DMovePoly).super_DPolyAction.m_Dist;
          TAngle<double>::operator-(&local_40);
          TAngle<double>::operator=(&this->m_Direction,&local_40);
          TVector2<double>::operator-(&local_50);
          TVector2<double>::operator=(&(this->super_DMovePoly).m_Speedv,&local_50);
          this->m_Close = false;
          SN_StartSequence((FPolyObj *)absSpeed,*(int *)((long)absSpeed + 200),SEQ_DOOR,0,false);
        }
      }
      else if (this->m_Type == PODOOR_SWING) {
        local_6d = true;
        if (0.0 < (this->super_DMovePoly).super_DPolyAction.m_Dist) {
          TAngle<double>::TAngle
                    ((TAngle<double> *)&absSpeed_1,(this->super_DMovePoly).super_DPolyAction.m_Speed
                    );
          local_6d = FPolyObj::RotatePolyobj(this_00,(DAngle *)&absSpeed_1,false);
        }
        if (local_6d == false) {
          if ((*(int *)((long)absSpeed + 0xc0) == 0) && ((this->m_Close & 1U) != 0)) {
            (this->super_DMovePoly).super_DPolyAction.m_Dist =
                 this->m_TotalDist - (this->super_DMovePoly).super_DPolyAction.m_Dist;
            (this->super_DMovePoly).super_DPolyAction.m_Speed =
                 -(this->super_DMovePoly).super_DPolyAction.m_Speed;
            this->m_Close = false;
            SN_StartSequence((FPolyObj *)absSpeed,*(int *)((long)absSpeed + 200),SEQ_DOOR,0,false);
          }
        }
        else {
          (this->super_DMovePoly).super_DPolyAction.m_Dist =
               (this->super_DMovePoly).super_DPolyAction.m_Dist -
               ABS((this->super_DMovePoly).super_DPolyAction.m_Speed);
          if ((this->super_DMovePoly).super_DPolyAction.m_Dist <= 0.0) {
            SN_StopSequence((FPolyObj *)absSpeed);
            if (((this->m_Close & 1U) == 0) && (-1 < this->m_WaitTics)) {
              (this->super_DMovePoly).super_DPolyAction.m_Dist = this->m_TotalDist;
              this->m_Close = true;
              this->m_Tics = this->m_WaitTics;
              (this->super_DMovePoly).super_DPolyAction.m_Speed =
                   -(this->super_DMovePoly).super_DPolyAction.m_Speed;
            }
            else {
              if ((this->m_Close & 1U) == 0) {
                *(undefined1 *)((long)absSpeed + 0xc5) = 1;
              }
              (*(this->super_DMovePoly).super_DPolyAction.super_DThinker.super_DObject._vptr_DObject
                [4])();
            }
          }
        }
      }
    }
    else {
      iVar2 = this->m_Tics + -1;
      this->m_Tics = iVar2;
      if (iVar2 == 0) {
        SN_StartSequence(this_00,this_00->seqType,SEQ_DOOR,(uint)(this->m_Close & 1),false);
      }
    }
  }
  return;
}

Assistant:

void DPolyDoor::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly == NULL) return;

	if (m_Tics)
	{
		if (!--m_Tics)
		{
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, m_Close);
		}
		return;
	}
	switch (m_Type)
	{
	case PODOOR_SLIDE:
		if (m_Dist <= 0 || poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				if (!m_Close && m_WaitTics >= 0)
				{
					m_Dist = m_TotalDist;
					m_Close = true;
					m_Tics = m_WaitTics;
					m_Direction = -m_Direction;
					m_Speedv = -m_Speedv;
				}
				else
				{
					// if set to wait infinitely, Hexen kept the dead thinker to block the polyobject from getting activated again but that causes some problems
					// with the subsectorlinks and the interpolation. Better delete the thinker and use a different means to block it.
					if (!m_Close) poly->bBlocked = true;
					Destroy ();
				}
			}
			poly->UpdateLinks();
		}
		else
		{
			if (poly->crush || !m_Close)
			{ // continue moving if the poly is a crusher, or is opening
				return;
			}
			else
			{ // open back up
				m_Dist = m_TotalDist - m_Dist;
				m_Direction = -m_Direction;
				m_Speedv = -m_Speedv;
				m_Close = false;
				SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			}
		}
		break;

	case PODOOR_SWING:
		if (m_Dist <= 0 || poly->RotatePolyobj (m_Speed))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				if (!m_Close && m_WaitTics >= 0)
				{
					m_Dist = m_TotalDist;
					m_Close = true;
					m_Tics = m_WaitTics;
					m_Speed = -m_Speed;
				}
				else
				{
					if (!m_Close) poly->bBlocked = true;
					Destroy ();
				}
			}
		}
		else
		{
			if(poly->crush || !m_Close)
			{ // continue moving if the poly is a crusher, or is opening
				return;
			}
			else
			{ // open back up and rewait
				m_Dist = m_TotalDist - m_Dist;
				m_Speed = -m_Speed;
				m_Close = false;
				SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			}
		}			
		break;

	default:
		break;
	}
}